

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::dht_live_nodes_alert::dht_live_nodes_alert
          (dht_live_nodes_alert *this,stack_allocator *alloc,sha1_hash *nid,
          vector<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<libtorrent::digest32<160L>,_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
          *nodes)

{
  undefined8 uVar1;
  rep rVar2;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_0045fff0;
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->super_alert).m_timestamp.__d.__r = rVar2;
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__alert_00461ab8;
  uVar1 = *(undefined8 *)((nid->m_number)._M_elems + 2);
  *(undefined8 *)(this->node_id).m_number._M_elems = *(undefined8 *)(nid->m_number)._M_elems;
  *(undefined8 *)((this->node_id).m_number._M_elems + 2) = uVar1;
  (this->node_id).m_number._M_elems[4] = (nid->m_number)._M_elems[4];
  (this->m_alloc)._M_data = alloc;
  this->m_v4_num_nodes = 0;
  this->m_v6_num_nodes = 0;
  this->m_v4_nodes_idx = -1;
  this->m_v6_nodes_idx = -1;
  anon_unknown_62::write_nodes((anon_unknown_62 *)&local_30,alloc,nodes);
  this->m_v4_num_nodes = local_24;
  (this->m_v4_nodes_idx).m_idx = local_28;
  this->m_v6_num_nodes = local_2c;
  (this->m_v6_nodes_idx).m_idx = local_30;
  return;
}

Assistant:

dht_live_nodes_alert::dht_live_nodes_alert(aux::stack_allocator& alloc
		, sha1_hash const& nid
		, std::vector<std::pair<sha1_hash, udp::endpoint>> const& nodes)
		: node_id(nid)
		, m_alloc(alloc)
	{
		std::tie(m_v4_num_nodes, m_v4_nodes_idx, m_v6_num_nodes, m_v6_nodes_idx)
			= write_nodes(alloc, nodes);
	}